

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregator.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_7d218::MinKernel::aggregate
          (MinKernel *this,CaliperMetadataAccessInterface *db,EntryList *list)

{
  bool bVar1;
  cali_id_t cVar2;
  cali_id_t cVar3;
  cali_variant_t local_80;
  reference local_70;
  Entry *e;
  const_iterator __end2;
  const_iterator __begin2;
  EntryList *__range2;
  Attribute local_48;
  Attribute min_attr;
  Attribute local_30;
  Attribute target_attr;
  lock_guard<std::mutex> g;
  EntryList *list_local;
  CaliperMetadataAccessInterface *db_local;
  MinKernel *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&target_attr,&this->m_lock);
  local_30 = Config::get_target_attr(this->m_config,db);
  local_48 = Config::get_min_attr(this->m_config,db);
  bVar1 = cali::Attribute::operator_cast_to_bool(&local_48);
  if (bVar1) {
    __end2 = std::vector<cali::Entry,_std::allocator<cali::Entry>_>::begin(list);
    e = (Entry *)std::vector<cali::Entry,_std::allocator<cali::Entry>_>::end(list);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
                                       *)&e), bVar1) {
      local_70 = __gnu_cxx::
                 __normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
                 ::operator*(&__end2);
      cVar2 = cali::Entry::attribute(local_70);
      cVar3 = cali::Attribute::id(&local_30);
      if (cVar2 == cVar3) {
LAB_0032f0ef:
        local_80 = (cali_variant_t)cali::Entry::value(local_70);
        cali::Variant::min(&this->m_min,(Variant *)&local_80);
      }
      else {
        cVar2 = cali::Entry::attribute(local_70);
        cVar3 = cali::Attribute::id(&local_48);
        if (cVar2 == cVar3) goto LAB_0032f0ef;
      }
      __gnu_cxx::
      __normal_iterator<const_cali::Entry_*,_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>
      ::operator++(&__end2);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&target_attr);
  return;
}

Assistant:

virtual void aggregate(CaliperMetadataAccessInterface& db, const EntryList& list)
    {
        std::lock_guard<std::mutex> g(m_lock);

        Attribute target_attr = m_config->get_target_attr(db);
        Attribute min_attr    = m_config->get_min_attr(db);

        if (!min_attr)
            return;

        for (const Entry& e : list) {
            if (e.attribute() == target_attr.id() || e.attribute() == min_attr.id())
                m_min.min(e.value());
        }
    }